

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

int __thiscall f8n::db::Connection::Open(Connection *this,string *database,uint options,uint cache)

{
  int iVar1;
  char *zFilename;
  int error;
  uint cache_local;
  uint options_local;
  string *database_local;
  Connection *this_local;
  
  zFilename = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_open(zFilename,&this->connection);
  if (iVar1 == 0) {
    Initialize(this,cache);
  }
  return iVar1;
}

Assistant:

int Connection::Open(const std::string &database, unsigned int options, unsigned int cache) {
    int error;

    #ifdef WIN32
        std::wstring wdatabase = u8to16(database);
        error = sqlite3_open16(wdatabase.c_str(), &this->connection);
    #else
        error = sqlite3_open(database.c_str(), &this->connection);
    #endif

    if (error == SQLITE_OK) {
        this->Initialize(cache);
    }

    return error;
}